

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_encoder.h
# Opt level: O0

void rc_bittree(lzma_range_encoder *rc,probability *probs,uint32_t bit_count,uint32_t symbol)

{
  uint bit_00;
  uint local_24;
  uint32_t bit;
  uint32_t model_index;
  uint32_t symbol_local;
  uint32_t bit_count_local;
  probability *probs_local;
  lzma_range_encoder *rc_local;
  
  local_24 = 1;
  model_index = bit_count;
  do {
    model_index = model_index - 1;
    bit_00 = symbol >> ((byte)model_index & 0x1f) & 1;
    rc_bit(rc,probs + local_24,bit_00);
    local_24 = local_24 * 2 + bit_00;
  } while (model_index != 0);
  return;
}

Assistant:

static inline void
rc_bittree(lzma_range_encoder *rc, probability *probs,
		uint32_t bit_count, uint32_t symbol)
{
	uint32_t model_index = 1;

	do {
		const uint32_t bit = (symbol >> --bit_count) & 1;
		rc_bit(rc, &probs[model_index], bit);
		model_index = (model_index << 1) + bit;
	} while (bit_count != 0);
}